

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::UniformBlockAdvanced::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  UniformBlockAdvanced *this_local;
  
  local_18 = this;
  this_local = (UniformBlockAdvanced *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430                         \nin vec4 position;                    \nlayout(row_major) uniform SimpleBlock {   \n   mat4 a;                                \n   vec4 b[10];                            \n};                                        \nvoid main(void)                      \n{                                    \n    float tmp;                       \n    tmp = a[0][0] + b[0].x;          \n    gl_Position = position * tmp;    \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                         \n"
			   "in vec4 position;                    \n"
			   ""
			   "layout(row_major) uniform SimpleBlock {   \n"
			   "   mat4 a;                                \n"
			   "   vec4 b[10];                            \n"
			   "};                                        \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    float tmp;                       \n"
			   "    tmp = a[0][0] + b[0].x;          \n"
			   "    gl_Position = position * tmp;    \n"
			   "}";
	}